

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<2UL> mserialize::cx_strcat<1ul,1ul>(cx_string<1UL> *strings,cx_string<1UL> *strings_1)

{
  cx_string<2UL> cVar1;
  cx_string<1UL> *in_RSI;
  cx_string<1UL> *in_RDI;
  size_t s;
  size_t i;
  char *out;
  size_t size [3];
  char *data [3];
  char buffer [3];
  char local_74 [3];
  ulong local_70;
  ulong local_68;
  char *local_60;
  ulong local_58;
  size_t local_50;
  size_t local_48;
  char *local_38;
  data_ref local_30;
  data_ref local_28;
  char local_1b [3];
  cx_string<1UL> *local_18;
  cx_string<1UL> *local_10;
  cx_string<2UL> local_3;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_1b,0,3);
  local_38 = "";
  local_30 = cx_string<1UL>::data(local_10);
  local_28 = cx_string<1UL>::data(local_18);
  local_58 = 0;
  local_50 = cx_string<1UL>::size(local_10);
  local_48 = cx_string<1UL>::size(local_18);
  local_60 = local_1b;
  for (local_68 = 1; local_68 < 3; local_68 = local_68 + 1) {
    for (local_70 = 0; local_70 < (&local_58)[local_68]; local_70 = local_70 + 1) {
      *local_60 = (&local_38)[local_68][local_70];
      local_60 = local_60 + 1;
    }
  }
  cx_string<2UL>::cx_string(&local_3,local_1b);
  cVar1._data[0] = local_3._data[0];
  cVar1._data[1] = local_3._data[1];
  cVar1._data[2] = local_3._data[2];
  return (cx_string<2UL>)cVar1._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}